

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

void __thiscall
testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::~Matcher
          (Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>).
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00173a00;
  this_00 = (this->super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>)
            .impl_.
            super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  operator_delete(this,0x18);
  return;
}

Assistant:

class GTEST_API_ Matcher<const internal::StringView&>
    : public internal::MatcherBase<const internal::StringView&> {
 public:
  Matcher() {}

  explicit Matcher(const MatcherInterface<const internal::StringView&>* impl)
      : internal::MatcherBase<const internal::StringView&>(impl) {}

  // Allows the user to write str instead of Eq(str) sometimes, where
  // str is a std::string object.
  Matcher(const std::string& s);  // NOLINT

  // Allows the user to write "foo" instead of Eq("foo") sometimes.
  Matcher(const char* s);  // NOLINT

  // Allows the user to pass absl::string_views or std::string_views directly.
  Matcher(internal::StringView s);  // NOLINT
}